

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
google::protobuf::Symbol::parent_name_key
          (pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,Symbol *this)

{
  FieldDescriptor *this_00;
  FileDescriptor *pFVar1;
  Descriptor *p;
  SymbolBase *pSVar2;
  long *plVar3;
  ulong uVar4;
  SymbolBase *pSVar5;
  char *pcVar6;
  ushort *puVar7;
  bool bVar8;
  anon_class_8_1_8991fb9c or_file;
  anon_class_8_1_8991fb9c local_30;
  LogMessageFatal local_28;
  
  this_00 = (FieldDescriptor *)this->ptr_;
  local_30.this = this;
  switch((this_00->super_SymbolBase).symbol_type_) {
  case '\x01':
    pFVar1 = (FileDescriptor *)
             parent_name_key::anon_class_8_1_8991fb9c::operator()
                       (&local_30,this_00->containing_type_);
    pSVar2 = (SymbolBase *)0x0;
    if (this->ptr_->symbol_type_ == '\x01') {
      pSVar2 = this->ptr_;
    }
    puVar7 = *(ushort **)(pSVar2 + 0x10);
    break;
  case '\x02':
    if ((this_00->field_0x1 & 8) == 0) {
      p = this_00->containing_type_;
    }
    else {
      p = FieldDescriptor::extension_scope(this_00);
    }
    pFVar1 = (FileDescriptor *)parent_name_key::anon_class_8_1_8991fb9c::operator()(&local_30,p);
    puVar7 = (ushort *)(this_00->all_names_).payload_;
    break;
  case '\x03':
  case '\b':
    puVar7 = (ushort *)(this_00->all_names_).payload_;
    pFVar1 = this_00->file_;
    break;
  case '\x04':
    pFVar1 = (FileDescriptor *)
             parent_name_key::anon_class_8_1_8991fb9c::operator()(&local_30,this_00->type_once_);
    pSVar2 = this->ptr_;
    bVar8 = pSVar2->symbol_type_ == '\x04';
    goto LAB_0014f680;
  case '\x05':
    pFVar1 = (FileDescriptor *)
             parent_name_key::anon_class_8_1_8991fb9c::operator()(&local_30,this_00->file_->pool_);
    plVar3 = *(long **)(this->ptr_ + (8 - (ulong)(this->ptr_->symbol_type_ != '\x05')));
    goto LAB_0014f6b9;
  case '\x06':
    plVar3 = *(long **)((long)&this_00->number_ + 3);
    pFVar1 = *(FileDescriptor **)((long)&(this_00->all_names_).payload_ + 7);
LAB_0014f6b9:
    pcVar6 = (char *)*plVar3;
    uVar4 = plVar3[1];
    goto LAB_0014f6e7;
  case '\a':
    pFVar1 = GetFile(this);
    pSVar2 = this->ptr_;
    bVar8 = pSVar2->symbol_type_ == '\a';
LAB_0014f680:
    pSVar5 = (SymbolBase *)0x0;
    if (bVar8) {
      pSVar5 = pSVar2;
    }
    puVar7 = *(ushort **)(pSVar5 + 8);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x343,"false");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
  }
  uVar4 = (ulong)*puVar7;
  pcVar6 = (char *)(~uVar4 + (long)puVar7);
LAB_0014f6e7:
  __return_storage_ptr__->first = pFVar1;
  (__return_storage_ptr__->second)._M_len = uVar4;
  (__return_storage_ptr__->second)._M_str = pcVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const void*, absl::string_view> parent_name_key() const {
    const auto or_file = [&](const void* p) { return p ? p : GetFile(); };
    switch (type()) {
      case MESSAGE:
        return {or_file(descriptor()->containing_type()), descriptor()->name()};
      case FIELD: {
        auto* field = field_descriptor();
        return {or_file(field->is_extension() ? field->extension_scope()
                                              : field->containing_type()),
                field->name()};
      }
      case ONEOF:
        return {oneof_descriptor()->containing_type(),
                oneof_descriptor()->name()};
      case ENUM:
        return {or_file(enum_descriptor()->containing_type()),
                enum_descriptor()->name()};
      case ENUM_VALUE:
        return {or_file(enum_value_descriptor()->type()->containing_type()),
                enum_value_descriptor()->name()};
      case ENUM_VALUE_OTHER_PARENT:
        return {enum_value_descriptor()->type(),
                enum_value_descriptor()->name()};
      case SERVICE:
        return {GetFile(), service_descriptor()->name()};
      case METHOD:
        return {method_descriptor()->service(), method_descriptor()->name()};
      default:
        ABSL_CHECK(false);
    }
    return {};
  }